

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_and_relation.cpp
# Opt level: O2

int textinput(void)

{
  undefined8 in_RAX;
  char ch;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::operator>>((istream *)&std::cin,(char *)((long)&uStack_28 + 7));
  while( true ) {
    std::istream::get((char *)&std::cin);
    if (((byte)cos[*(long *)(std::cin + -0x18)] & 5) != 0) break;
    std::operator<<((ostream *)&std::cout,uStack_28._7_1_);
  }
  std::operator<<((ostream *)&std::cout,"\n");
}

Assistant:

int textinput () {
    using namespace std;

    char ch;
    int count = 0;

//    cout << "Enter something, enter # to stop:\n";
//    cout << "Enter something:\n";
    cin >> ch;
    //  cin.get() 可以获取空格、换行
    cin.get(ch);

    //  检测EOF： cin.fail() == true
    while (cin.fail() == false) {
        cout << ch;
        ++count;
//        cin >> ch;
        cin.get(ch);
    }

    cout << "\n" << count << " charactors readed.";

    return 0;
}